

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O2

aom_codec_err_t aom_codec_set_option(aom_codec_ctx_t *ctx,char *name,char *value)

{
  aom_codec_set_option_fn_t_conflict p_Var1;
  aom_codec_err_t aVar2;
  
  if (ctx != (aom_codec_ctx_t *)0x0) {
    aVar2 = AOM_CODEC_ERROR;
    if (((ctx->iface != (aom_codec_iface_t *)0x0) &&
        ((aom_codec_alg_priv_t_conflict *)ctx->priv != (aom_codec_alg_priv_t_conflict *)0x0)) &&
       (p_Var1 = ctx->iface->set_option, p_Var1 != (aom_codec_set_option_fn_t_conflict)0x0)) {
      aVar2 = (*p_Var1)((aom_codec_alg_priv_t_conflict *)ctx->priv,name,value);
    }
    ctx->err = aVar2;
    return aVar2;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

aom_codec_err_t aom_codec_set_option(aom_codec_ctx_t *ctx, const char *name,
                                     const char *value) {
  if (!ctx) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (!ctx->iface || !ctx->priv || !ctx->iface->set_option) {
    ctx->err = AOM_CODEC_ERROR;
    return AOM_CODEC_ERROR;
  }
  ctx->err =
      ctx->iface->set_option((aom_codec_alg_priv_t *)ctx->priv, name, value);
  return ctx->err;
}